

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

int TestSignatureCandidate(Byte *testBytes)

{
  uint local_1c;
  uint i;
  Byte *testBytes_local;
  
  local_1c = 0;
  while( true ) {
    if (5 < local_1c) {
      return 1;
    }
    if (testBytes[local_1c] != k7zSignature[local_1c]) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

static int TestSignatureCandidate(const Byte *testBytes)
{
  unsigned i;
  for (i = 0; i < k7zSignatureSize; i++)
    if (testBytes[i] != k7zSignature[i])
      return 0;
  return 1;
}